

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O1

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  Curl_addrinfo *pCVar5;
  sockaddr *psVar6;
  char *pcVar7;
  Curl_addrinfo *pCVar8;
  char *__dest;
  long lVar9;
  long lVar10;
  bool bVar11;
  Curl_addrinfo *local_50;
  
  if (he != (hostent *)0x0) {
    pcVar7 = *he->h_addr_list;
    if (pcVar7 == (char *)0x0) {
      bVar11 = true;
      pCVar8 = (Curl_addrinfo *)0x0;
    }
    else {
      iVar3 = 0;
      lVar9 = 8;
      local_50 = (Curl_addrinfo *)0x0;
      pCVar8 = (Curl_addrinfo *)0x0;
      do {
        sVar4 = strlen(he->h_name);
        lVar10 = 0x10;
        if (he->h_addrtype == 10) {
          lVar10 = 0x1c;
        }
        pCVar5 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar4 + lVar10 + 0x31);
        if (pCVar5 == (Curl_addrinfo *)0x0) {
          iVar3 = 0x1b;
        }
        else {
          pCVar5->ai_addr = (sockaddr *)(pCVar5 + 1);
          __dest = (char *)((long)&pCVar5[1].ai_flags + lVar10);
          pCVar5->ai_canonname = __dest;
          memcpy(__dest,he->h_name,sVar4 + 1);
          if (pCVar8 == (Curl_addrinfo *)0x0) {
            pCVar8 = pCVar5;
          }
          if (local_50 != (Curl_addrinfo *)0x0) {
            local_50->ai_next = pCVar5;
          }
          iVar1 = he->h_addrtype;
          pCVar5->ai_family = iVar1;
          pCVar5->ai_socktype = 1;
          pCVar5->ai_addrlen = (curl_socklen_t)lVar10;
          local_50 = pCVar5;
          if (iVar1 == 10) {
            psVar6 = pCVar5->ai_addr;
            uVar2 = *(undefined8 *)(pcVar7 + 8);
            *(undefined8 *)(psVar6->sa_data + 6) = *(undefined8 *)pcVar7;
            psVar6[1].sa_family = (short)uVar2;
            psVar6[1].sa_data[0] = (char)((ulong)uVar2 >> 0x10);
            psVar6[1].sa_data[1] = (char)((ulong)uVar2 >> 0x18);
            psVar6[1].sa_data[2] = (char)((ulong)uVar2 >> 0x20);
            psVar6[1].sa_data[3] = (char)((ulong)uVar2 >> 0x28);
            psVar6[1].sa_data[4] = (char)((ulong)uVar2 >> 0x30);
            psVar6[1].sa_data[5] = (char)((ulong)uVar2 >> 0x38);
          }
          else {
            if (iVar1 != 2) goto LAB_001121ac;
            psVar6 = pCVar5->ai_addr;
            *(undefined4 *)(psVar6->sa_data + 2) = *(undefined4 *)pcVar7;
          }
          psVar6->sa_family = (sa_family_t)he->h_addrtype;
          *(ushort *)psVar6->sa_data = (ushort)port << 8 | (ushort)port >> 8;
        }
LAB_001121ac:
        if (pCVar5 == (Curl_addrinfo *)0x0) break;
        pcVar7 = *(char **)((long)he->h_addr_list + lVar9);
        lVar9 = lVar9 + 8;
      } while (pcVar7 != (char *)0x0);
      bVar11 = iVar3 == 0;
    }
    if (bVar11) {
      return pCVar8;
    }
    while (pCVar8 != (Curl_addrinfo *)0x0) {
      pCVar5 = pCVar8->ai_next;
      (*Curl_cfree)(pCVar8);
      pCVar8 = pCVar5;
    }
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  struct Curl_addrinfo *ai;
  struct Curl_addrinfo *prevai = NULL;
  struct Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i = 0; (curr = he->h_addr_list[i]) != NULL; i++) {
    size_t ss_size;
    size_t namelen = strlen(he->h_name) + 1; /* include zero termination */
#ifdef ENABLE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
    else
#endif
      ss_size = sizeof(struct sockaddr_in);

    /* allocate memory to told the struct, the address and the name */
    ai = calloc(1, sizeof(struct Curl_addrinfo) + ss_size + namelen);
    if(!ai) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    /* put the address after the struct */
    ai->ai_addr = (void *)((char *)ai + sizeof(struct Curl_addrinfo));
    /* then put the name after the address */
    ai->ai_canonname = (char *)ai->ai_addr + ss_size;
    memcpy(ai->ai_canonname, he->h_name, namelen);

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch(ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
      addr->sin_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
      addr6->sin6_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}